

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase458::run(TestCase458 *this)

{
  Reader reader_00;
  size_t sVar1;
  size_t sVar2;
  ArrayPtr<const_unsigned_char> AVar3;
  ArrayPtr<const_unsigned_char> packedBytes;
  ReaderOptions options;
  undefined8 in_stack_fffffffffffffc18;
  Reader local_398;
  ArrayPtr<capnp::word> local_368;
  ReaderOptions local_358;
  undefined1 local_348 [8];
  PackedMessageReader reader;
  size_t local_1f8;
  size_t local_1f0;
  bool local_1e1;
  undefined1 auStack_1e0 [7];
  bool _kj_shouldLog;
  size_t local_1d8;
  undefined1 local_1d0 [8];
  TestPipe pipe;
  Builder local_158;
  Builder local_130;
  undefined1 local_108 [8];
  TestMessageBuilder builder;
  TestCase458 *this_local;
  
  builder._240_8_ = this;
  TestMessageBuilder::TestMessageBuilder((TestMessageBuilder *)local_108,2);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_158,(MessageBuilder *)local_108);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructField(&local_130,&local_158);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructField
            ((Builder *)&pipe.readPos,&local_130);
  TestPipe::TestPipe((TestPipe *)local_1d0,1);
  writePackedMessage((OutputStream *)&pipe,(MessageBuilder *)local_108);
  sVar1 = computeSerializedSizeInWords((MessageBuilder *)local_108);
  _auStack_1e0 = TestPipe::getArray((TestPipe *)local_1d0);
  AVar3.size_ = (uchar *)auStack_1e0._8_8_;
  AVar3.ptr = AVar3.size_;
  sVar2 = computeUnpackedSizeInWords((capnp *)auStack_1e0._0_8_,AVar3);
  if (sVar1 != sVar2) {
    local_1e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1e1 != false) {
      local_1f0 = computeSerializedSizeInWords((MessageBuilder *)local_108);
      AVar3 = TestPipe::getArray((TestPipe *)local_1d0);
      packedBytes.size_ = (uchar *)AVar3.size_;
      reader.super_InputStreamMessageReader._296_8_ = AVar3.ptr;
      packedBytes.ptr = packedBytes.size_;
      local_1f8 = computeUnpackedSizeInWords
                            ((capnp *)reader.super_InputStreamMessageReader._296_8_,packedBytes);
      kj::_::Debug::log<char_const(&)[106],unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
                 ,0x1d1,ERROR,
                 "\"failed: expected \" \"(computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))\", computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray())"
                 ,(char (*) [106])
                  "failed: expected (computeSerializedSizeInWords(builder)) == (computeUnpackedSizeInWords(pipe.getArray()))"
                 ,&local_1f0,&local_1f8);
      local_1e1 = false;
    }
  }
  local_358.traversalLimitInWords = 0;
  local_358.nestingLimit = 0;
  local_358._12_4_ = 0;
  ReaderOptions::ReaderOptions(&local_358);
  kj::ArrayPtr<capnp::word>::ArrayPtr(&local_368,(void *)0x0);
  options.nestingLimit = local_358.nestingLimit;
  options.traversalLimitInWords = local_358.traversalLimitInWords;
  options._12_4_ = 0;
  PackedMessageReader::PackedMessageReader
            ((PackedMessageReader *)local_348,(BufferedInputStream *)local_1d0,options,local_368);
  MessageReader::getRoot<capnproto_test::capnp::test::TestAllTypes>
            (&local_398,(MessageReader *)&reader.super_PackedInputStream.inner);
  reader_00._reader.capTable = (CapTableReader *)local_398._reader.data;
  reader_00._reader.segment = (SegmentReader *)local_398._reader.capTable;
  reader_00._reader.data = local_398._reader.pointers;
  reader_00._reader.pointers = (WirePointer *)local_398._reader._32_8_;
  reader_00._reader.dataSize = local_398._reader.nestingLimit;
  reader_00._reader.pointerCount = local_398._reader._44_2_;
  reader_00._reader._38_2_ = local_398._reader._46_2_;
  reader_00._reader._40_8_ = in_stack_fffffffffffffc18;
  checkTestMessageAllZero(reader_00);
  PackedMessageReader::~PackedMessageReader((PackedMessageReader *)local_348);
  TestPipe::~TestPipe((TestPipe *)local_1d0);
  TestMessageBuilder::~TestMessageBuilder((TestMessageBuilder *)local_108);
  return;
}

Assistant:

TEST(Packed, RoundTripAllZeroEvenSegmentCountLazy) {
  TestMessageBuilder builder(2);
  builder.initRoot<TestAllTypes>().initStructField().initStructField();

  TestPipe pipe(1);
  writePackedMessage(pipe, builder);

  EXPECT_EQ(computeSerializedSizeInWords(builder), computeUnpackedSizeInWords(pipe.getArray()));

  PackedMessageReader reader(pipe);
  checkTestMessageAllZero(reader.getRoot<TestAllTypes>());
}